

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanocat.c
# Opt level: O1

void nn_rw_loop(nn_options_t *options,int sock)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint64_t uVar4;
  int *piVar5;
  long lVar6;
  int millis;
  long lVar7;
  void *buf;
  char *local_40;
  long local_38;
  
  local_38 = (long)(int)(options->send_interval * 1000.0);
  iVar1 = (int)(options->recv_timeout * 1000.0);
LAB_00103f63:
  uVar4 = nn_clock_ms();
  uVar2 = nn_send(sock,(options->data_to_send).data,(long)(options->data_to_send).length,0);
  if ((int)uVar2 < 0) {
    piVar5 = __errno_location();
    if (*piVar5 == 0xb) {
      nn_rw_loop_cold_1();
      goto LAB_00103fa7;
    }
  }
  nn_assert_errno(~uVar2 >> 0x1f,"Can\'t send");
LAB_00103fa7:
  if (options->send_interval <= 0.0 && options->send_interval != 0.0) {
    nn_recv_loop(options,sock);
    return;
  }
  lVar6 = uVar4 + local_38;
LAB_00103fba:
  uVar4 = nn_clock_ms();
  lVar7 = lVar6 - uVar4;
  if (0 < lVar7) {
    iVar3 = iVar1;
    if (lVar7 < iVar1) {
      iVar3 = (int)lVar7;
    }
    millis = (int)lVar7;
    if (-1 < iVar1) {
      millis = iVar3;
    }
    nn_set_recv_timeout(sock,millis);
    uVar2 = nn_recv(sock,&local_40,0xffffffffffffffff);
    if ((int)uVar2 < 0) goto LAB_0010402b;
    goto LAB_00103ffb;
  }
  goto LAB_00103f63;
LAB_0010402b:
  piVar5 = __errno_location();
  iVar3 = *piVar5;
  if (iVar3 != 0xb) {
    if ((iVar3 == 0x9523dfe) || (iVar3 == 0x6e)) {
      uVar4 = nn_clock_ms();
      lVar7 = lVar6 - uVar4;
      if (0 < lVar7) {
        nn_sleep((int)lVar7);
      }
    }
    else {
LAB_00103ffb:
      nn_assert_errno(~uVar2 >> 0x1f,"Can\'t recv");
      nn_print_message(options,local_40,uVar2);
      nn_freemsg(local_40);
    }
  }
  goto LAB_00103fba;
}

Assistant:

void nn_rw_loop (nn_options_t *options, int sock)
{
    int rc;
    void *buf;
    uint64_t start_time;
    int64_t time_to_sleep, interval, recv_timeout;

    interval = (int)(options->send_interval*1000);
    recv_timeout = (int)(options->recv_timeout*1000);

    for (;;) {
        start_time = nn_clock_ms();
        rc = nn_send (sock,
            options->data_to_send.data, options->data_to_send.length,
            0);
        if (rc < 0 && errno == EAGAIN) {
            fprintf (stderr, "Message not sent (EAGAIN)\n");
        } else {
            nn_assert_errno (rc >= 0, "Can't send");
        }
        if (options->send_interval < 0) {  /*  Never send any more  */
            nn_recv_loop (options, sock);
            return;
        }

        for (;;) {
            time_to_sleep = (start_time + interval) - nn_clock_ms();
            if (time_to_sleep <= 0) {
                break;
            }
            if (recv_timeout >= 0 && time_to_sleep > recv_timeout)
            {
                time_to_sleep = recv_timeout;
            }
            nn_set_recv_timeout (sock, (int) time_to_sleep);
            rc = nn_recv (sock, &buf, NN_MSG, 0);
            if (rc < 0) {
                if (errno == EAGAIN) {
                    continue;
                } else if (errno == ETIMEDOUT || errno == EFSM) {
                    time_to_sleep = (start_time + interval) - nn_clock_ms();
                    if (time_to_sleep > 0)
                        nn_sleep ((int) time_to_sleep);
                    continue;
                }
            }
            nn_assert_errno (rc >= 0, "Can't recv");
            nn_print_message (options, buf, rc);
            nn_freemsg (buf);
        }
    }
}